

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O1

int socket(int __domain,int __type,int __protocol)

{
  bool bVar1;
  uint __fd;
  uint uVar2;
  rpchook_t *prVar3;
  
  if (g_sys_socket_func == (socket_pfn_t)0x0) {
    g_sys_socket_func = (socket_pfn_t)dlsym(0xffffffffffffffff,"socket");
  }
  bVar1 = co_is_enable_sys_hook();
  if (bVar1) {
    __fd = (*g_sys_socket_func)(__domain,__type,__protocol);
    if (-1 < (int)__fd) {
      prVar3 = (rpchook_t *)calloc(1,0x38);
      (prVar3->read_timeout).tv_sec = 0x28;
      (prVar3->write_timeout).tv_sec = 10;
      g_rpchook_socket_fd[__fd] = prVar3;
      prVar3->domain = __domain;
      uVar2 = (*g_sys_fcntl_func)(__fd,3,0);
      fcntl(__fd,4,(ulong)uVar2);
    }
  }
  else {
    __fd = (*g_sys_socket_func)(__domain,__type,__protocol);
  }
  return __fd;
}

Assistant:

int socket(int domain, int type, int protocol)
{
	HOOK_SYS_FUNC( socket );

	if( !co_is_enable_sys_hook() )
	{
		return g_sys_socket_func( domain,type,protocol );
	}
	int fd = g_sys_socket_func(domain,type,protocol);
	if( fd < 0 )
	{
		return fd;
	}

	rpchook_t *lp = alloc_by_fd( fd );
	lp->domain = domain;
	
	fcntl( fd, F_SETFL, g_sys_fcntl_func(fd, F_GETFL,0 ) );

	return fd;
}